

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

void __thiscall
mocker::ir::FunctionModule::FunctionModule(FunctionModule *this,FunctionModule *param_1)

{
  size_t sVar1;
  FunctionModule *param_1_local;
  FunctionModule *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->args,&param_1->args);
  std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::list
            (&this->bbs,&param_1->bbs);
  this->isExternal = param_1->isExternal;
  sVar1 = param_1->tempRegCounter;
  this->bbsSz = param_1->bbsSz;
  this->tempRegCounter = sVar1;
  std::
  unordered_map<unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>_>
  ::unordered_map(&this->bbMap,&param_1->bbMap);
  std::
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::unordered_map(&this->predecessors,&param_1->predecessors);
  return;
}

Assistant:

FunctionModule(const FunctionModule &) = default;